

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizepolicy.h
# Opt level: O0

quint32 QSizePolicy::toControlTypeFieldValue(ControlType type)

{
  uint uVar1;
  quint32 in_EDI;
  
  uVar1 = qCountTrailingZeroBits(in_EDI);
  return uVar1;
}

Assistant:

static constexpr quint32 toControlTypeFieldValue(ControlType type) noexcept
    {
        /*
          The control type is a flag type, with values 0x1, 0x2, 0x4, 0x8, 0x10,
          etc. In memory, we pack it onto the available bits (CTSize) in
          setControlType(), and unpack it here.

          Example:

          0x00000001 maps to 0
          0x00000002 maps to 1
          0x00000004 maps to 2
          0x00000008 maps to 3
          etc.
        */

        return qCountTrailingZeroBits(static_cast<quint32>(type));
    }